

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O3

bool __thiscall stk::FileRead::getMatInfo(FileRead *this,char *fileName)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  StkFormat SVar8;
  unsigned_long uVar9;
  long lVar10;
  long __off;
  ostream *poVar11;
  FILE *__stream;
  float fVar12;
  double dVar13;
  char rate;
  SINT32 namesize;
  char mi [2];
  UINT32 type;
  char name [3];
  SINT32 nametype;
  SINT32 columns;
  SINT32 rows;
  SINT32 chunkSize;
  char head [5];
  byte local_88;
  undefined1 uStack_87;
  undefined2 uStack_86;
  undefined4 uStack_84;
  int local_80;
  short local_7a;
  uint local_78;
  short local_73;
  undefined1 local_71;
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  char local_5d [4];
  undefined1 local_59;
  StkFormat local_58;
  StkFormat local_50;
  StkFormat local_48;
  StkFormat local_40;
  StkFormat local_38;
  
  iVar4 = fseek((FILE *)this->fd_,0,0);
  if ((iVar4 != -1) && (sVar6 = fread(local_5d,4,1,(FILE *)this->fd_), sVar6 == 1)) {
    local_59 = 0;
    pcVar7 = strchr(local_5d,0x30);
    if (pcVar7 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead: ",10);
      if (fileName == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(Stk::oStream__abi_cxx11_ + -0x18) + 0x1163a0);
      }
      else {
        sVar6 = strlen(fileName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&Stk::oStream__abi_cxx11_,fileName,sVar6);
      }
      poVar11 = (ostream *)&Stk::oStream__abi_cxx11_;
      pcVar7 = " appears to be a Version 4 MAT-file, which is not currently supported.";
      lVar10 = 0x46;
      goto LAB_0010da60;
    }
    this->byteswap_ = false;
    iVar4 = fseek((FILE *)this->fd_,0x7e,0);
    if ((iVar4 != -1) && (sVar6 = fread(&local_7a,2,1,(FILE *)this->fd_), sVar6 == 1)) {
      if (local_7a == 0x494d) {
        this->byteswap_ = true;
      }
      else if (local_7a != 0x4d49) goto LAB_0010d9f9;
      local_40 = 0x20;
      local_48 = 0x10;
      local_50 = 8;
      local_58 = 2;
      local_38 = 1;
      bVar1 = false;
      bVar2 = false;
      while( true ) {
        lVar10 = ftell((FILE *)this->fd_);
        bVar3 = findNextMatArray(this,&local_64,(SINT32 *)&local_68,&local_6c,&local_70);
        if (!bVar3) {
          if (bVar2) {
            if (bVar1) {
              return true;
            }
            this->fileRate_ = 44100.0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&Stk::oStream__abi_cxx11_,
                       "FileRead: No sample rate found ... assuming 44100.0",0x33);
            Stk::handleError(&this->super_Stk,WARNING);
            return true;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&Stk::oStream__abi_cxx11_,
                     "FileRead: No audio data found in MAT-file (",0x2b);
          poVar11 = std::operator<<((ostream *)&Stk::oStream__abi_cxx11_,fileName);
          pcVar7 = ").";
          lVar10 = 2;
          goto LAB_0010da60;
        }
        if (!(bool)(local_6c == 1 & local_68 == 1 & ~bVar1)) break;
        local_80 = 4;
        if (local_70 == 1) {
          sVar6 = fread(&local_80,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010d9f9;
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&local_80);
          }
          if (local_80 != 2) goto switchD_0010dd94_caseD_8;
          local_80 = 8;
        }
        local_71 = 0;
        sVar6 = fread(&local_73,2,1,(FILE *)this->fd_);
        if (sVar6 != 1) goto LAB_0010d9f9;
        if (local_73 != 0x7366) goto switchD_0010dd94_caseD_8;
        iVar4 = fseek((FILE *)this->fd_,(long)local_80 + -2,1);
        if ((iVar4 == -1) || (sVar6 = fread(&local_78,4,1,(FILE *)this->fd_), sVar6 != 1))
        goto LAB_0010d9f9;
        if (this->byteswap_ == true) {
          Stk::swap32((uchar *)&local_78);
        }
        if (local_78 < 0x10000) {
          iVar4 = fseek((FILE *)this->fd_,4,1);
          if (iVar4 == -1) goto LAB_0010d9f9;
        }
        else {
          local_78 = local_78 & 0xffff;
        }
        switch(local_78) {
        case 1:
          sVar6 = fread(&local_88,1,1,(FILE *)this->fd_);
          if (sVar6 == 1) {
            uVar5 = (uint)(char)local_88;
            goto LAB_0010df6e;
          }
          goto LAB_0010d9f9;
        case 2:
          sVar6 = fread(&local_88,1,1,(FILE *)this->fd_);
          if (sVar6 == 1) {
            uVar5 = (uint)local_88;
            goto LAB_0010df6e;
          }
          goto LAB_0010d9f9;
        case 3:
          sVar6 = fread(&local_88,2,1,(FILE *)this->fd_);
          if (sVar6 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap16(&local_88);
            }
            uVar5 = (uint)CONCAT11(uStack_87,local_88);
            goto LAB_0010df6e;
          }
          goto LAB_0010d9f9;
        case 4:
          sVar6 = fread(&local_88,2,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010d9f9;
          if (this->byteswap_ == true) {
            Stk::swap16(&local_88);
          }
          uVar5 = (uint)CONCAT11(uStack_87,local_88);
LAB_0010df6e:
          dVar13 = (double)(int)uVar5;
          break;
        case 5:
          sVar6 = fread(&local_88,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010d9f9;
          if (this->byteswap_ == true) {
            Stk::swap32(&local_88);
          }
          dVar13 = (double)CONCAT22(uStack_86,CONCAT11(uStack_87,local_88));
          break;
        case 6:
          sVar6 = fread(&local_88,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010d9f9;
          if (this->byteswap_ == true) {
            Stk::swap32(&local_88);
          }
          dVar13 = (double)CONCAT22(uStack_86,CONCAT11(uStack_87,local_88));
          break;
        case 7:
          sVar6 = fread(&local_88,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010d9f9;
          if (this->byteswap_ == true) {
            Stk::swap32(&local_88);
          }
          dVar13 = (double)(float)CONCAT22(uStack_86,CONCAT11(uStack_87,local_88));
          break;
        default:
          goto switchD_0010dd94_caseD_8;
        case 9:
          sVar6 = fread(&local_88,8,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010d9f9;
          if (this->byteswap_ == true) {
            Stk::swap64(&local_88);
          }
          dVar13 = (double)CONCAT44(uStack_84,CONCAT22(uStack_86,CONCAT11(uStack_87,local_88)));
        }
        bVar1 = true;
        if (0.0 < dVar13) {
          this->fileRate_ = dVar13;
          bVar1 = true;
        }
switchD_0010dd94_caseD_8:
        if ((bVar2) && (bVar1)) {
          return true;
        }
LAB_0010de0c:
        iVar4 = fseek((FILE *)this->fd_,lVar10 + local_64 + 8,0);
        if (iVar4 == -1) goto LAB_0010d9f9;
      }
      if (bVar2) goto switchD_0010dd94_caseD_8;
      if (local_6c <= (int)local_68) {
        poVar11 = (ostream *)&Stk::oStream__abi_cxx11_;
        pcVar7 = 
        "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns)."
        ;
        lVar10 = 0x5d;
        goto LAB_0010da60;
      }
      this->channels_ = local_68;
      this->fileSize_ = (long)local_6c;
      local_88 = 4;
      uStack_87 = 0;
      uStack_86 = 0;
      __stream = (FILE *)this->fd_;
      __off = 4;
      if (local_70 != 1) {
LAB_0010dd03:
        iVar4 = fseek(__stream,__off,1);
        if ((iVar4 != -1) && (sVar6 = fread(&local_80,4,1,(FILE *)this->fd_), sVar6 == 1)) {
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&local_80);
          }
          SVar8 = local_38;
          switch(local_80) {
          case 1:
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&Stk::oStream__abi_cxx11_,
                       "FileRead: The MAT-file array data format (",0x2a);
            poVar11 = (ostream *)
                      std::ostream::operator<<((ostream *)&Stk::oStream__abi_cxx11_,local_80);
            pcVar7 = ") is not supported.";
            lVar10 = 0x13;
            goto LAB_0010da60;
          case 3:
            SVar8 = local_58;
            break;
          case 5:
            SVar8 = local_50;
            break;
          case 7:
            SVar8 = local_48;
            break;
          case 9:
            SVar8 = local_40;
          }
          this->dataType_ = SVar8;
          iVar4 = fseek((FILE *)this->fd_,4,1);
          if (iVar4 != -1) {
            uVar9 = ftell((FILE *)this->fd_);
            this->dataOffset_ = uVar9;
            bVar2 = true;
            if (bVar1) {
              return true;
            }
            goto LAB_0010de0c;
          }
        }
        goto LAB_0010d9f9;
      }
      sVar6 = fread(&local_88,4,1,__stream);
      if (sVar6 == 1) {
        if (this->byteswap_ == true) {
          Stk::swap32(&local_88);
        }
        fVar12 = ceilf((float)CONCAT22(uStack_86,CONCAT11(uStack_87,local_88)) * 0.125);
        iVar4 = (int)fVar12;
        local_88 = (byte)iVar4;
        uStack_87 = (undefined1)((uint)iVar4 >> 8);
        uStack_86 = (undefined2)((uint)iVar4 >> 0x10);
        __stream = (FILE *)this->fd_;
        __off = (long)(iVar4 << 3);
        goto LAB_0010dd03;
      }
    }
  }
LAB_0010d9f9:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead: Error reading MAT-file (",0x22);
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(Stk::oStream__abi_cxx11_ + -0x18) + 0x1163a0);
  }
  else {
    sVar6 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,fileName,sVar6);
  }
  poVar11 = (ostream *)&Stk::oStream__abi_cxx11_;
  pcVar7 = ") header.";
  lVar10 = 9;
LAB_0010da60:
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar7,lVar10);
  return false;
}

Assistant:

bool FileRead :: getMatInfo( const char *fileName )
{
  // MAT-file formatting information is available at:
  // http://www.mathworks.com/access/helpdesk/help/pdf_doc/matlab/matfile_format.pdf

  // Verify this is a version 5 MAT-file format.
  char head[5];
  if ( fseek(fd_, 0, SEEK_SET) == -1 ) goto error;
  if ( fread(&head, 4, 1, fd_) != 1 ) goto error;
  // If any of the first 4 characters of the header = 0, then this is
  // a Version 4 MAT-file.
  head[4] = '\0';
  if ( strstr(head, "0") ) {
    oStream_ << "FileRead: " << fileName << " appears to be a Version 4 MAT-file, which is not currently supported.";
    return false;
  }

  // Determine the endian-ness of the file.
  char mi[2];
  byteswap_ = false;
  // Locate "M" and "I" characters in header.
  if ( fseek(fd_, 126, SEEK_SET) == -1 ) goto error;
  if ( fread(&mi, 2, 1, fd_) != 1) goto error;
#ifdef __LITTLE_ENDIAN__
  if ( !strncmp(mi, "MI", 2) )
    byteswap_ = true;
  else if ( strncmp(mi, "IM", 2) ) goto error;
#else
  if ( !strncmp(mi, "IM", 2))
    byteswap_ = true;
  else if ( strncmp(mi, "MI", 2) ) goto error;
#endif

  // We are expecting a data element containing the audio data and an
  // optional data element containing the sample rate (with an array
  // name of "fs").  Both elements should be stored as a Matlab array
  // type (14).

  bool doneParsing, haveData, haveSampleRate;
  SINT32 chunkSize, rows, columns, nametype;
  long dataoffset;
  doneParsing = false;
  haveData = false;
  haveSampleRate = false;
  while ( !doneParsing ) {

    dataoffset = ftell( fd_ ); // save location in file
    if ( findNextMatArray( &chunkSize, &rows, &columns, &nametype ) == false ) {
      // No more Matlab array type chunks found.
      if ( !haveData ) {
        oStream_ << "FileRead: No audio data found in MAT-file (" << fileName << ").";
        return false;
      }
      else if ( !haveSampleRate ) {
        fileRate_ = 44100.0;
        oStream_ << "FileRead: No sample rate found ... assuming 44100.0";
        handleError( StkError::WARNING );
        return true;
      }
      else return true;
    }

    if ( !haveSampleRate && rows == 1 && columns == 1 ) { // Parse for sample rate.

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        if ( namesize != 2 ) goto tryagain; // expecting name = "fs"
        namesize = 8; // field must be padded to multiple of 8 bytes
      }
      char name[3]; name[2] = '\0';
      if ( fread(&name, 2, 1, fd_) != 1) goto error;
      if ( strncmp(name, "fs", 2) ) goto tryagain;

      // Jump to real part data subelement, which is likely to be in a
      // small data format.
      if ( fseek(fd_, namesize-2, SEEK_CUR) == -1 ) goto error;
      UINT32 type;
      StkFloat srate;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( (type & 0xffff0000) != 0 ) // small data format
        type = (type & 0x0000ffff);
      else
        if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      if ( type == 1 ) { // SINT8
        signed char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 2 ) { // UINT8
        unsigned char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 3 ) { // SINT16
        SINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 4 ) { // UINT16
        UINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 5 ) { // SINT32
        SINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 6 ) { // UINT32
        UINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 7 ) { // FLOAT32
        FLOAT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 9 ) { // FLOAT64
        FLOAT64 rate;
        if ( fread(&rate, 8, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap64((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else
        goto tryagain;

      if ( srate > 0 ) fileRate_ = srate;
      haveSampleRate = true;
    }
    else if ( !haveData ) { // Parse for data.

      // Assume channels = smaller of rows or columns.
      if ( rows < columns ) {
        channels_ = rows;
        fileSize_ = columns;
      }
      else {
        oStream_ << "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns).";
        return false;
      }

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        namesize = (SINT32) ceil((float)namesize / 8);
        if ( fseek( fd_, namesize*8, SEEK_CUR) == -1 ) goto error;  // jump over array name
      }
      else {
        if ( fseek( fd_, 4, SEEK_CUR ) == -1 ) goto error;
      }

      // Now at real part data subelement
      SINT32 type;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( type == 1 )  dataType_ = STK_SINT8;
      else if ( type == 3 ) dataType_ = STK_SINT16;
      else if ( type == 5 ) dataType_ = STK_SINT32;
      else if ( type == 7 ) dataType_ = STK_FLOAT32;
      else if ( type == 9 ) dataType_ = STK_FLOAT64;
      else {
        oStream_ << "FileRead: The MAT-file array data format (" << type << ") is not supported.";
        return false;
      }

      // Jump to the data.
      if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      dataOffset_ = ftell(fd_);
      haveData = true;
    }

  tryagain:
    if ( haveData && haveSampleRate ) doneParsing = true;
    else // jump to end of data element and keep trying
      if ( fseek( fd_, dataoffset+chunkSize+8, SEEK_SET) == -1 ) goto error;
  }

  return true;

 error:
  oStream_ << "FileRead: Error reading MAT-file (" << fileName << ") header.";
  return false;
}